

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O3

void __thiscall llvm::DataExtractor::skip(DataExtractor *this,Cursor *C,uint64_t Length)

{
  ulong in_RAX;
  ErrorInfoBase *pEVar1;
  char *Msg;
  ulong uVar2;
  error_code EC;
  ulong local_18;
  
  uVar2 = (ulong)(C->Err).Payload & 0xfffffffffffffffe;
  pEVar1 = (ErrorInfoBase *)(uVar2 != 0 | uVar2);
  (C->Err).Payload = pEVar1;
  if (uVar2 == 0) {
    uVar2 = C->Offset;
    if ((uVar2 + Length < uVar2) || ((this->Data).Length <= (Length + uVar2) - 1)) {
      local_18 = in_RAX;
      Msg = (char *)std::_V2::generic_category();
      EC._M_cat = (error_category *)0x54;
      EC._0_8_ = &local_18;
      createStringError(EC,Msg);
      pEVar1 = (ErrorInfoBase *)(local_18 | 1);
      (C->Err).Payload = pEVar1;
    }
    else {
      C->Offset = uVar2 + Length;
    }
  }
  uVar2 = (ulong)pEVar1 & 0xfffffffffffffffe;
  pEVar1 = (ErrorInfoBase *)&DAT_00000001;
  if (uVar2 != 0) {
    pEVar1 = (ErrorInfoBase *)(uVar2 != 0 | uVar2);
  }
  (C->Err).Payload = pEVar1;
  return;
}

Assistant:

void DataExtractor::skip(Cursor &C, uint64_t Length) const {
  ErrorAsOutParameter ErrAsOut(&C.Err);
  if (isError(&C.Err))
    return;

  if (isValidOffsetForDataOfSize(C.Offset, Length))
    C.Offset += Length;
  else
    unexpectedEndReached(&C.Err);
}